

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_effective_nonce(secp256k1_gej *out_nonce,secp256k1_ge *nonce_pts,secp256k1_scalar *b)

{
  secp256k1_gej tmp;
  secp256k1_fe *in_stack_00000128;
  secp256k1_ge *in_stack_00000130;
  secp256k1_gej *in_stack_00000138;
  secp256k1_gej *in_stack_00000140;
  secp256k1_scalar *in_stack_00000838;
  secp256k1_scalar *in_stack_00000840;
  secp256k1_gej *in_stack_00000848;
  secp256k1_gej *in_stack_00000850;
  secp256k1_ge *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  
  secp256k1_gej_set_ge(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  secp256k1_ecmult(in_stack_00000850,in_stack_00000848,in_stack_00000840,in_stack_00000838);
  secp256k1_gej_add_ge_var(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

static void secp256k1_effective_nonce(secp256k1_gej *out_nonce, const secp256k1_ge *nonce_pts, const secp256k1_scalar *b) {
    secp256k1_gej tmp;

    secp256k1_gej_set_ge(&tmp, &nonce_pts[1]);
    secp256k1_ecmult(out_nonce, &tmp, b, NULL);
    secp256k1_gej_add_ge_var(out_nonce, out_nonce, &nonce_pts[0], NULL);
}